

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.hpp
# Opt level: O1

string * __thiscall m2d::savanna::url::port_str_abi_cxx11_(string *__return_storage_ptr__,url *this)

{
  pointer pcVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  undefined1 *local_68;
  size_t local_60;
  undefined1 local_58 [16];
  undefined1 *local_48;
  size_t local_40;
  undefined1 local_38 [16];
  
  iVar2 = std::__cxx11::string::compare((char *)&this->port_);
  if (iVar2 == 0) {
    pcVar1 = (this->scheme_)._M_dataplus._M_p;
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,pcVar1,pcVar1 + (this->scheme_)._M_string_length);
    if (local_40 == DAT_0021aa40) {
      if (local_40 == 0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp(local_48,url_scheme::https_abi_cxx11_,local_40);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    bVar6 = true;
    if (!bVar5) {
      local_68 = local_58;
      pcVar1 = (this->scheme_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,pcVar1,pcVar1 + (this->scheme_)._M_string_length);
      if (local_60 == _DAT_0021aa80) {
        if (local_60 != 0) {
          iVar2 = bcmp(local_68,url_scheme::wss_abi_cxx11_,local_60);
          bVar6 = iVar2 == 0;
        }
      }
      else {
        bVar6 = false;
      }
    }
    if ((!bVar5) && (local_68 != local_58)) {
      operator_delete(local_68);
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (bVar6) {
      pcVar4 = "443";
      pcVar3 = "";
    }
    else {
      pcVar4 = "80";
      pcVar3 = "";
    }
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (this->port_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->port_)._M_string_length);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string port_str()
		{
			if (port_ == "") {
				if (scheme() == savanna::url_scheme::https || scheme() == savanna::url_scheme::wss) {
					return "443";
				}
				return "80";
			}

			return port_;
		}